

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O0

void henson::Serialization<henson::Array>::load(BinaryBuffer *bb,Array *x)

{
  element_type *this;
  long in_RSI;
  variant<void_*,_float_*,_double_*,_int_*,_long_*> *in_RDI;
  void *data;
  size_t index;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff88;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff90;
  unsigned_long *in_stack_ffffffffffffffb8;
  undefined8 local_18;
  
  load<unsigned_long>((BinaryBuffer *)in_stack_ffffffffffffff90,
                      (unsigned_long *)in_stack_ffffffffffffff88);
  load<unsigned_long>((BinaryBuffer *)in_stack_ffffffffffffff90,
                      (unsigned_long *)in_stack_ffffffffffffff88);
  load<unsigned_long>((BinaryBuffer *)in_stack_ffffffffffffff90,
                      (unsigned_long *)in_stack_ffffffffffffff88);
  std::make_shared<std::vector<char,std::allocator<char>>,unsigned_long>(in_stack_ffffffffffffffb8);
  std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::operator=
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::~shared_ptr
            ((shared_ptr<std::vector<char,_std::allocator<char>_>_> *)0x32de67);
  std::
  __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x32de7f);
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x32de87);
  this = std::
         __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x32de9a);
  std::vector<char,_std::allocator<char>_>::size(this);
  load<char>((BinaryBuffer *)in_RDI,(char *)in_stack_ffffffffffffff88,0x32deb4);
  std::
  __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x32dec2);
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x32deca);
  if (local_18 == 0) {
    mpark::variant<void_*,_float_*,_double_*,_int_*,_long_*>::operator=<void_*,_0,_0UL,_void_*,_0>
              (in_RDI,(void **)in_stack_ffffffffffffff88);
  }
  else if (local_18 == 1) {
    mpark::variant<void_*,_float_*,_double_*,_int_*,_long_*>::operator=<float_*,_0,_1UL,_float_*,_0>
              (in_RDI,(float **)in_stack_ffffffffffffff88);
  }
  else if (local_18 == 2) {
    mpark::variant<void_*,_float_*,_double_*,_int_*,_long_*>::
    operator=<double_*,_0,_2UL,_double_*,_0>(in_RDI,(double **)in_stack_ffffffffffffff88);
  }
  else if (local_18 == 3) {
    mpark::variant<void_*,_float_*,_double_*,_int_*,_long_*>::operator=<int_*,_0,_3UL,_int_*,_0>
              (in_RDI,(int **)in_stack_ffffffffffffff88);
  }
  else if (local_18 == 4) {
    mpark::variant<void_*,_float_*,_double_*,_int_*,_long_*>::operator=<long_*,_0,_4UL,_long_*,_0>
              (in_RDI,(long **)in_stack_ffffffffffffff88);
  }
  *(undefined8 *)(in_RSI + 0x20) = *(undefined8 *)(in_RSI + 0x10);
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Array& x)
  {
    size_t index;
    henson::load(bb, index);
    henson::load(bb, x.type);
    henson::load(bb, x.count);
    x.storage = std::make_shared<std::vector<char>>(x.count*x.type);
    henson::load(bb, x.storage->data(), x.storage->size());

    void* data = x.storage->data();
    if (index == 0)
        x.address = static_cast<variant_alternative_t<0, Array::Address>>(data);
    else if (index == 1)
        x.address = static_cast<variant_alternative_t<1, Array::Address>>(data);
    else if (index == 2)
        x.address = static_cast<variant_alternative_t<2, Array::Address>>(data);
    else if (index == 3)
        x.address = static_cast<variant_alternative_t<3, Array::Address>>(data);
    else if (index == 4)
        x.address = static_cast<variant_alternative_t<4, Array::Address>>(data);

    x.stride = x.type;
  }